

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,StringTree *params_6,StringTree *params_7,
          StringTree *params_8,ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  size_t result_2;
  String local_a8;
  size_t local_90;
  char *local_88;
  size_t sStack_80;
  size_t local_78;
  size_t sStack_70;
  size_t local_68;
  char *local_60;
  size_t sStack_58;
  size_t local_50;
  char *local_48;
  size_t sStack_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_90 = this->size_;
  local_88 = (params->text).content.ptr;
  sStack_80 = params_1->size_;
  local_78 = params_2->size_;
  sStack_70 = params_3->size_;
  local_68 = params_4->size_;
  local_60 = params_5->ptr;
  sStack_58 = params_6->size_;
  local_50 = params_7->size_;
  local_48 = (params_8->text).content.ptr;
  sStack_40 = params_9->size_;
  sVar3 = 0;
  lVar5 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_90 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  __return_storage_ptr__->size_ = sVar3;
  sVar3 = 0;
  local_90 = 0;
  local_60 = (char *)0x0;
  sStack_58 = 0;
  local_50 = 0;
  lVar5 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_90 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  local_38 = params_3;
  heapString(&local_a8,sVar3);
  pcVar4 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar4,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_a8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_a8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_a8.content.disposer;
  local_90 = 1;
  local_88 = (char *)0x0;
  sStack_80 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_68 = 0;
  local_60 = (char *)0x1;
  sStack_58 = 1;
  local_50 = 1;
  local_48 = (char *)0x0;
  sStack_40 = 0;
  sVar3 = 0;
  lVar5 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_90 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x58);
  local_a8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_a8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_a8.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_a8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_a8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_a8.content.disposer;
  pcVar4 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar4,0,this,(ArrayPtr<const_char> *)params,params_1,params_2,
             local_38,params_4,(StringTree *)params_5,params_6,params_7,
             (ArrayPtr<const_char> *)params_8,params_9);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}